

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O0

bool __thiscall glslang::TSymbolTable::isFunctionNameVariable(TSymbolTable *this,TString *name)

{
  bool bVar1;
  const_reference ppTVar2;
  bool local_25;
  int local_24;
  bool found;
  bool variable;
  TString *pTStack_20;
  int level;
  TString *name_local;
  TSymbolTable *this_local;
  
  if ((this->separateNameSpaces & 1U) == 0) {
    pTStack_20 = name;
    name_local = (TString *)this;
    local_24 = currentLevel(this);
    do {
      ppTVar2 = std::
                vector<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                ::operator[](&this->table,(long)local_24);
      bVar1 = TSymbolTableLevel::findFunctionVariableName(*ppTVar2,pTStack_20,&local_25);
      if (bVar1) {
        return (bool)(local_25 & 1);
      }
      local_24 = local_24 + -1;
    } while (-1 < local_24);
  }
  return false;
}

Assistant:

bool isFunctionNameVariable(const TString& name) const
    {
        if (separateNameSpaces)
            return false;

        int level = currentLevel();
        do {
            bool variable;
            bool found = table[level]->findFunctionVariableName(name, variable);
            if (found)
                return variable;
            --level;
        } while (level >= 0);

        return false;
    }